

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall cpptempl::data_ptr::operator=(data_ptr *this,param *data)

{
  element_type *peVar1;
  string data_str;
  stringstream ss;
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  peVar1 = (data->impl_).super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**(code **)(*(long *)peVar1 + 0x18))(peVar1,local_190);
  std::ios::exceptions((int)(stringstream *)&ss + (int)*(undefined8 *)(_ss + -0x18));
  std::__cxx11::stringbuf::str();
  operator=(this,&data_str);
  std::__cxx11::string::~string((string *)&data_str);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void data_ptr::operator = (const T& data) {
        std::stringstream ss;
        ss << data;
        ss.exceptions(std::ios::failbit);
        std::string data_str = ss.str();
        this->operator =(data_str);
    }